

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

void vstprintf_s(tchar_t *Out,size_t OutLen,tchar_t *Mask,__va_list_tag *Arg)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  __va_list_tag *p_Var6;
  bool_t bVar7;
  ulong uVar8;
  tchar_t *ptVar9;
  size_t sVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  double dVar16;
  fourcc_t *local_210;
  long *local_1f8;
  double *local_1e0;
  uint local_1bc;
  uint local_1b4;
  double *local_1b0;
  tchar_t *local_190;
  undefined8 *local_188;
  tchar_t *local_170;
  undefined8 *local_168;
  undefined4 *local_150;
  int *local_138;
  long *local_120;
  int *local_100;
  size_t Written;
  fourcc_t FourCC;
  uint i_1;
  int max_total_chars;
  int max_decimal_digits;
  int max_integer_digits;
  uint i;
  int64_t ww;
  int64_t _lvs;
  int64_t lvs;
  size_t n;
  char *InA;
  tchar_t *In;
  int Decimals;
  bool_t Long;
  bool_t AlignLeft;
  bool_t Sign;
  bool_t Unsigned;
  bool_t ZeroFill;
  uint w0;
  uint q;
  uint w;
  uint v;
  intptr_t ptr;
  intptr_t Width;
  double _dvs;
  double dvs;
  long lStack_30;
  int vs;
  int64_t vl;
  __va_list_tag *Arg_local;
  tchar_t *Mask_local;
  size_t OutLen_local;
  tchar_t *Out_local;
  
  Arg_local = (__va_list_tag *)Mask;
  Mask_local = (tchar_t *)OutLen;
  OutLen_local = (size_t)Out;
  do {
    while( true ) {
      while( true ) {
        bVar13 = false;
        if ((tchar_t *)0x1 < Mask_local) {
          bVar13 = (char)Arg_local->gp_offset != '\0';
        }
        if (!bVar13) {
          if (Mask_local != (tchar_t *)0x0) {
            if (Mask_local != (tchar_t *)0x0) {
              *(undefined1 *)OutLen_local = 0;
            }
            return;
          }
          __assert_fail("OutLen>0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                        ,0x285,
                        "void vstprintf_s(tchar_t *, size_t, const tchar_t *, struct __va_list_tag *)"
                       );
        }
        if ((char)Arg_local->gp_offset == '%') break;
        *(char *)OutLen_local = (char)Arg_local->gp_offset;
        Mask_local = Mask_local + -1;
        Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
        OutLen_local = OutLen_local + 1;
      }
      p_Var6 = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
      if ((char)p_Var6->gp_offset != '%') break;
      *(char *)OutLen_local = (char)p_Var6->gp_offset;
      Mask_local = Mask_local + -1;
      Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 2);
      OutLen_local = OutLen_local + 1;
    }
    bVar13 = (char)p_Var6->gp_offset == '-';
    if (bVar13) {
      p_Var6 = (__va_list_tag *)((long)&Arg_local->gp_offset + 2);
    }
    Arg_local = p_Var6;
    bVar14 = (char)Arg_local->gp_offset == '0';
    if (bVar14) {
      Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
    }
    ptr = -1;
    bVar7 = IsDigit((int)(char)Arg_local->gp_offset);
    if (bVar7 != 0) {
      ptr = 0;
      while (bVar7 = IsDigit((int)(char)Arg_local->gp_offset), bVar7 != 0) {
        ptr = ptr * 10 + (long)((char)Arg_local->gp_offset + -0x30);
        Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
      }
    }
    In._4_4_ = (uint)((char)Arg_local->gp_offset == '.');
    if (In._4_4_ != 0) {
      Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
      In._4_4_ = 0;
      bVar7 = IsDigit((int)(char)Arg_local->gp_offset);
      if (bVar7 != 0) {
        while (bVar7 = IsDigit((int)(char)Arg_local->gp_offset), bVar7 != 0) {
          In._4_4_ = In._4_4_ * 10 + (char)Arg_local->gp_offset + -0x30;
          Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
        }
      }
    }
    bVar1 = false;
    if ((char)Arg_local->gp_offset == '*') {
      Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
      uVar5 = Arg->gp_offset;
      if (uVar5 < 0x29) {
        local_100 = (int *)((long)(int)uVar5 + (long)Arg->reg_save_area);
        Arg->gp_offset = uVar5 + 8;
      }
      else {
        local_100 = (int *)Arg->overflow_arg_area;
        Arg->overflow_arg_area = local_100 + 2;
      }
      ptr = (intptr_t)*local_100;
    }
    for (; (char)Arg_local->gp_offset == 'l';
        Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1)) {
      bVar1 = true;
    }
    if ((((char)Arg_local->gp_offset == 'I') && (*(char *)((long)&Arg_local->gp_offset + 1) == '6'))
       && (*(char *)((long)&Arg_local->gp_offset + 2) == '4')) {
      bVar1 = true;
      Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 3);
    }
    bVar15 = (char)Arg_local->gp_offset == 'u';
    if (bVar15) {
      Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
    }
    switch((char)Arg_local->gp_offset) {
    case 'E':
    case 'e':
      uVar5 = Arg->fp_offset;
      if (uVar5 < 0xa1) {
        local_1e0 = (double *)((long)(int)uVar5 + (long)Arg->reg_save_area);
        Arg->fp_offset = uVar5 + 0x10;
      }
      else {
        local_1e0 = (double *)Arg->overflow_arg_area;
        Arg->overflow_arg_area = local_1e0 + 1;
      }
      _dvs = *local_1e0;
      if ((_dvs < 0.0) && ((tchar_t *)0x1 < Mask_local)) {
        *(undefined1 *)OutLen_local = 0x2d;
        Mask_local = Mask_local + -1;
        _dvs = -_dvs;
        OutLen_local = OutLen_local + 1;
      }
      sVar10 = OutLen_local;
      dvs._4_4_ = 0;
      Width = 0x3ff0000000000000;
      if (_dvs < 1.0) {
        for (; _dvs * (double)Width < 1.0; Width = (intptr_t)((double)Width * 10.0)) {
          dvs._4_4_ = dvs._4_4_ + -1;
        }
      }
      else {
        for (; 1.0 < _dvs * (double)Width; Width = (intptr_t)((double)Width * 10.0)) {
          dvs._4_4_ = dvs._4_4_ + 1;
        }
        _dvs = _dvs * 10.0;
        dvs._4_4_ = dvs._4_4_ + -1;
      }
      dVar16 = (double)Width * _dvs;
      if ((tchar_t *)0x4 < Mask_local) {
        *(char *)OutLen_local = (char)(int)dVar16 + '0';
        *(undefined1 *)(OutLen_local + 1) = 0x2e;
        dVar16 = (dVar16 - (double)(int)dVar16) * 10.0;
        if (dVar16 - (double)(int)dVar16 <= 0.5) {
          *(char *)(OutLen_local + 2) = (char)(int)dVar16 + '0';
        }
        else {
          *(char *)(OutLen_local + 2) = (char)(int)(dVar16 + 1.0) + '0';
        }
        OutLen_local = OutLen_local + 3;
        *(char *)OutLen_local = (char)Arg_local->gp_offset;
        Mask_local = Mask_local + -4;
        OutLen_local = sVar10 + 4;
      }
      if (((tchar_t *)0x1 < Mask_local) && (dvs._4_4_ < 0)) {
        *(undefined1 *)OutLen_local = 0x2d;
        Mask_local = Mask_local + -1;
        dvs._4_4_ = -dvs._4_4_;
        OutLen_local = OutLen_local + 1;
      }
      if ((tchar_t *)0x3 < Mask_local) {
        *(char *)OutLen_local = (char)(dvs._4_4_ / 100) + '0';
        pcVar12 = (char *)(OutLen_local + 2);
        *(char *)(OutLen_local + 1) = (char)((dvs._4_4_ % 100) / 10) + '0';
        OutLen_local = OutLen_local + 3;
        *pcVar12 = (char)((dvs._4_4_ % 100) % 10) + '0';
        Mask_local = Mask_local + -3;
      }
      break;
    case 'G':
    case 'f':
    case 'g':
      uVar5 = Arg->fp_offset;
      if (uVar5 < 0xa1) {
        local_1b0 = (double *)((long)(int)uVar5 + (long)Arg->reg_save_area);
        Arg->fp_offset = uVar5 + 0x10;
      }
      else {
        local_1b0 = (double *)Arg->overflow_arg_area;
        Arg->overflow_arg_area = local_1b0 + 1;
      }
      _dvs = *local_1b0;
      if (Mask_local != (tchar_t *)0x0) {
        bVar14 = _dvs < 0.0;
        if ((bVar14) && ((tchar_t *)0x1 < Mask_local)) {
          _dvs = -_dvs;
        }
        if (-1 < ptr) {
          iVar3 = get_integers((long)_dvs);
          i_1 = get_decimals((((int)ptr - iVar3) + -1) - (uint)bVar14,(long)_dvs);
          _lvs = 1;
          ww = (int64_t)(int)_dvs;
          ZeroFill._0_4_ = 0;
          w0 = 0;
          while (uVar5 = i_1 - 1, 0 < (int)i_1) {
            _lvs = _lvs * 10;
            uVar4 = (uint)(_dvs * (double)_lvs + -(double)(ww * 10));
            ww = (ulong)uVar4 + ww * 10;
            ZeroFill._0_4_ = (uint)ZeroFill + 1;
            i_1 = uVar5;
            if (uVar4 != 0) {
              w0 = (uint)ZeroFill;
            }
          }
          if ((int)In._4_4_ < 1) {
            i_1 = w0;
          }
          else {
            if ((int)In._4_4_ < (int)w0) {
              local_1b4 = w0;
            }
            else {
              local_1b4 = In._4_4_;
            }
            i_1 = local_1b4;
          }
          if (ptr < (int)(iVar3 + (uint)bVar14 + (uint)(i_1 != 0))) {
            *(undefined1 *)OutLen_local = 0x65;
            Mask_local = Mask_local + -1;
            OutLen_local = OutLen_local + 1;
            break;
          }
          while( true ) {
            bVar1 = false;
            if ((!bVar13) &&
               (bVar1 = false, (int)(iVar3 + i_1 + (uint)bVar14 + (uint)(i_1 != 0)) < ptr)) {
              bVar1 = (tchar_t *)0x1 < Mask_local;
            }
            if (!bVar1) break;
            *(undefined1 *)OutLen_local = 0x20;
            ptr = ptr + -1;
            Mask_local = Mask_local + -1;
            OutLen_local = OutLen_local + 1;
          }
        }
        uVar5 = (uint)_dvs;
        if ((bVar14) && (((_dvs != 0.0 || (NAN(_dvs))) && ((tchar_t *)0x1 < Mask_local)))) {
          *(undefined1 *)OutLen_local = 0x2d;
          Mask_local = Mask_local + -1;
          OutLen_local = OutLen_local + 1;
        }
        for (w0 = 1000000000; q = uVar5, uVar5 < w0 && 1 < w0; w0 = w0 / 10) {
        }
        for (; w0 != 0; w0 = w0 / 10) {
          iVar3 = (q / w0) * w0;
          if (((tchar_t *)0x1 < Mask_local) &&
             ((ptr < 0 || (lVar11 = ptr + -1, bVar13 = 0 < ptr, ptr = lVar11, bVar13)))) {
            *(char *)OutLen_local = (char)(q / w0) + '0';
            Mask_local = Mask_local + -1;
            OutLen_local = OutLen_local + 1;
          }
          q = q - iVar3;
        }
        if (In._4_4_ == 0) {
          In._4_4_ = 0x1e;
        }
        In._4_4_ = get_decimals(In._4_4_,(long)(int)uVar5);
        _lvs = 1;
        ww = (int64_t)(int)uVar5;
        ZeroFill._0_4_ = 0;
        w0 = 0;
        while (iVar3 = In._4_4_ + -1, 0 < (int)In._4_4_) {
          _lvs = _lvs * 10;
          uVar4 = (uint)(_dvs * (double)_lvs + -(double)(ww * 10));
          ww = (ulong)uVar4 + ww * 10;
          ZeroFill._0_4_ = (uint)ZeroFill + 1;
          In._4_4_ = iVar3;
          if (uVar4 != 0) {
            w0 = (uint)ZeroFill;
          }
        }
        if (((char)Arg_local->gp_offset == 'f') && (w0 != 0)) {
          if (w0 < 6) {
            local_1bc = 6;
          }
          else {
            local_1bc = w0;
          }
          w0 = local_1bc;
        }
        if ((w0 != 0) && ((tchar_t *)0x1 < Mask_local)) {
          *(undefined1 *)OutLen_local = 0x2e;
          _lvs = 1;
          ww = (int64_t)(int)uVar5;
          while( true ) {
            OutLen_local = OutLen_local + 1;
            Mask_local = Mask_local + -1;
            ptr = ptr + -1;
            if (w0 == 0 || Mask_local < (tchar_t *)0x2) break;
            _lvs = _lvs * 10;
            ZeroFill._4_4_ = (uint)(_dvs * (double)_lvs + -(double)(ww * 10));
            ww = (ulong)ZeroFill._4_4_ + ww * 10;
            if ((w0 - 1 == 0) && (5.0 <= _dvs * (double)_lvs + -(double)ww)) {
              ZeroFill._4_4_ = ZeroFill._4_4_ + 1;
            }
            *(char *)OutLen_local = (char)ZeroFill._4_4_ + '0';
            w0 = w0 - 1;
          }
          for (; 0 < ptr && (tchar_t *)0x1 < Mask_local; Mask_local = Mask_local + -1) {
            *(undefined1 *)OutLen_local = 0x20;
            ptr = ptr + -1;
            OutLen_local = OutLen_local + 1;
          }
        }
      }
      break;
    case 'S':
      uVar5 = Arg->gp_offset;
      if (uVar5 < 0x29) {
        local_188 = (undefined8 *)((long)(int)uVar5 + (long)Arg->reg_save_area);
        Arg->gp_offset = uVar5 + 8;
      }
      else {
        local_188 = (undefined8 *)Arg->overflow_arg_area;
        Arg->overflow_arg_area = local_188 + 1;
      }
      n = *local_188;
      ptVar9 = (tchar_t *)strlen((char *)n);
      if (Mask_local + -1 < ptVar9) {
        local_190 = Mask_local + -1;
      }
      else {
        local_190 = (tchar_t *)strlen((char *)n);
      }
      lvs = (int64_t)local_190;
      ptr = ptr - (long)local_190;
      if (!bVar13) {
        for (; ptr = ptr + -1, -1 < ptr && (tchar_t *)0x1 < Mask_local; Mask_local = Mask_local + -1
            ) {
          *(undefined1 *)OutLen_local = 0x20;
          OutLen_local = OutLen_local + 1;
        }
      }
      while( true ) {
        bVar13 = false;
        if ((lvs != 0) && (bVar13 = false, (tchar_t *)0x1 < Mask_local)) {
          bVar13 = *(char *)n != '\0';
        }
        if (!bVar13) break;
        *(undefined1 *)OutLen_local = *(undefined1 *)n;
        n = n + 1;
        OutLen_local = OutLen_local + 1;
        Mask_local = Mask_local + -1;
        lvs = lvs + -1;
      }
      for (; ptr = ptr + -1, -1 < ptr && (tchar_t *)0x1 < Mask_local; Mask_local = Mask_local + -1)
      {
        *(undefined1 *)OutLen_local = 0x20;
        OutLen_local = OutLen_local + 1;
      }
      break;
    case 'X':
    case 'd':
    case 'i':
    case 'x':
      if (bVar1) {
        uVar5 = Arg->gp_offset;
        if (uVar5 < 0x29) {
          local_120 = (long *)((long)(int)uVar5 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar5 + 8;
        }
        else {
          local_120 = (long *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = local_120 + 1;
        }
        lStack_30 = *local_120;
      }
      else {
        uVar5 = Arg->gp_offset;
        if (uVar5 < 0x29) {
          local_138 = (int *)((long)(int)uVar5 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar5 + 8;
        }
        else {
          local_138 = (int *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = local_138 + 2;
        }
        lStack_30 = (long)*local_138;
      }
      if (((char)Arg_local->gp_offset == 'x') || ((char)Arg_local->gp_offset == 'X')) {
        bVar15 = true;
        ZeroFill._4_4_ = 0x10;
        _max_integer_digits = 0x10000000;
      }
      else {
        ZeroFill._4_4_ = 10;
        _max_integer_digits = 100000000000;
      }
      bVar13 = false;
      if (lStack_30 < 0) {
        bVar13 = (bool)(bVar15 ^ 1);
      }
      if (bVar13) {
        lStack_30 = -lStack_30;
        ptr = ptr + -1;
      }
      ZeroFill._0_4_ = 1;
      for (; 1 < ptr; ptr = ptr + -1) {
        ZeroFill._0_4_ = ZeroFill._4_4_ * (uint)ZeroFill;
      }
      for (; lStack_30 < _max_integer_digits && (long)(ulong)(uint)ZeroFill < _max_integer_digits;
          _max_integer_digits = _max_integer_digits / (long)(ulong)ZeroFill._4_4_) {
      }
      for (; 0 < _max_integer_digits;
          _max_integer_digits = _max_integer_digits / (long)(ulong)ZeroFill._4_4_) {
        uVar8 = lStack_30 / _max_integer_digits;
        uVar5 = (uint)uVar8;
        lStack_30 = lStack_30 - (uVar8 & 0xffffffff) * _max_integer_digits;
        if ((((tchar_t *)0x1 < Mask_local) && (bVar13)) &&
           ((_max_integer_digits == 1 || ((bVar14 || (uVar5 != 0)))))) {
          *(undefined1 *)OutLen_local = 0x2d;
          Mask_local = Mask_local + -1;
          bVar13 = false;
          OutLen_local = OutLen_local + 1;
        }
        if ((tchar_t *)0x1 < Mask_local) {
          if (((uVar5 != 0) || (bVar14)) || (_max_integer_digits == 1)) {
            bVar14 = true;
            cVar2 = (char)uVar8;
            if (uVar5 < 10) {
              max_decimal_digits._0_1_ = cVar2 + '0';
            }
            else if ((char)Arg_local->gp_offset == 'X') {
              max_decimal_digits._0_1_ = cVar2 + '7';
            }
            else {
              max_decimal_digits._0_1_ = cVar2 + 'W';
            }
          }
          else {
            max_decimal_digits._0_1_ = ' ';
          }
          *(char *)OutLen_local = (char)max_decimal_digits;
          Mask_local = Mask_local + -1;
          OutLen_local = OutLen_local + 1;
        }
      }
      break;
    case 'c':
      ptr = ptr + -1;
      if (!bVar13) {
        for (; ptr = ptr + -1, -1 < ptr && (tchar_t *)0x1 < Mask_local; Mask_local = Mask_local + -1
            ) {
          *(undefined1 *)OutLen_local = 0x20;
          OutLen_local = OutLen_local + 1;
        }
      }
      uVar5 = Arg->gp_offset;
      if (uVar5 < 0x29) {
        local_150 = (undefined4 *)((long)(int)uVar5 + (long)Arg->reg_save_area);
        Arg->gp_offset = uVar5 + 8;
      }
      else {
        local_150 = (undefined4 *)Arg->overflow_arg_area;
        Arg->overflow_arg_area = local_150 + 2;
      }
      *(char *)OutLen_local = (char)*local_150;
      while( true ) {
        OutLen_local = OutLen_local + 1;
        Mask_local = Mask_local + -1;
        ptr = ptr + -1;
        if (ptr < 0 || Mask_local < (tchar_t *)0x2) break;
        *(undefined1 *)OutLen_local = 0x20;
      }
      break;
    case 'p':
      while( true ) {
        bVar14 = false;
        if ((8 < ptr) && (bVar14 = false, !bVar13)) {
          bVar14 = (tchar_t *)0x1 < Mask_local;
        }
        if (!bVar14) break;
        ptr = ptr + -1;
        *(undefined1 *)OutLen_local = 0x20;
        Mask_local = Mask_local + -1;
        OutLen_local = OutLen_local + 1;
      }
      uVar5 = Arg->gp_offset;
      if (uVar5 < 0x29) {
        local_1f8 = (long *)((long)(int)uVar5 + (long)Arg->reg_save_area);
        Arg->gp_offset = uVar5 + 8;
      }
      else {
        local_1f8 = (long *)Arg->overflow_arg_area;
        Arg->overflow_arg_area = local_1f8 + 1;
      }
      lVar11 = *local_1f8;
      dvs._4_4_ = 0x1c;
      for (; (tchar_t *)0x1 < Mask_local && -1 < dvs._4_4_; Mask_local = Mask_local + -1) {
        uVar5 = (uint)(lVar11 >> ((byte)dvs._4_4_ & 0x3f)) & 0xf;
        cVar2 = (char)uVar5;
        if (uVar5 < 10) {
          *(char *)OutLen_local = cVar2 + '0';
        }
        else {
          *(char *)OutLen_local = cVar2 + '7';
        }
        OutLen_local = OutLen_local + 1;
        dvs._4_4_ = dvs._4_4_ + -4;
      }
      for (; 8 < ptr && (tchar_t *)0x1 < Mask_local; Mask_local = Mask_local + -1) {
        ptr = ptr + -1;
        *(undefined1 *)OutLen_local = 0x20;
        OutLen_local = OutLen_local + 1;
      }
      break;
    case 'r':
      uVar5 = Arg->gp_offset;
      if (uVar5 < 0x29) {
        local_210 = (fourcc_t *)((long)(int)uVar5 + (long)Arg->reg_save_area);
        Arg->gp_offset = uVar5 + 8;
      }
      else {
        local_210 = (fourcc_t *)Arg->overflow_arg_area;
        Arg->overflow_arg_area = local_210 + 2;
      }
      if ((tchar_t *)0x4 < Mask_local) {
        sVar10 = FourCCToString((tchar_t *)OutLen_local,(size_t)Mask_local,*local_210);
        Mask_local = Mask_local + sVar10;
        OutLen_local = sVar10 + OutLen_local;
      }
      break;
    case 's':
      uVar5 = Arg->gp_offset;
      if (uVar5 < 0x29) {
        local_168 = (undefined8 *)((long)(int)uVar5 + (long)Arg->reg_save_area);
        Arg->gp_offset = uVar5 + 8;
      }
      else {
        local_168 = (undefined8 *)Arg->overflow_arg_area;
        Arg->overflow_arg_area = local_168 + 1;
      }
      pcVar12 = (char *)*local_168;
      if (pcVar12 != (char *)0x0) {
        ptVar9 = (tchar_t *)strlen(pcVar12);
        if (Mask_local + -1 < ptVar9) {
          local_170 = Mask_local + -1;
        }
        else {
          local_170 = (tchar_t *)strlen(pcVar12);
        }
        ptr = ptr - (long)local_170;
        if (!bVar13) {
          for (; ptr = ptr + -1, -1 < ptr && (tchar_t *)0x1 < Mask_local;
              Mask_local = Mask_local + -1) {
            *(undefined1 *)OutLen_local = 0x20;
            OutLen_local = OutLen_local + 1;
          }
        }
        memcpy((void *)OutLen_local,pcVar12,(size_t)local_170);
        OutLen_local = (size_t)(local_170 + OutLen_local);
        for (Mask_local = Mask_local + -(long)local_170; ptr = ptr + -1,
            -1 < ptr && (tchar_t *)0x1 < Mask_local; Mask_local = Mask_local + -1) {
          *(undefined1 *)OutLen_local = 0x20;
          OutLen_local = OutLen_local + 1;
        }
      }
    }
    Arg_local = (__va_list_tag *)((long)&Arg_local->gp_offset + 1);
  } while( true );
}

Assistant:

void vstprintf_s(tchar_t* Out,size_t OutLen,const tchar_t* Mask,va_list Arg)
{
    int64_t vl;
	int vs;
    double dvs, _dvs;
	intptr_t Width,ptr;
	unsigned int v,w,q,w0;
	bool_t ZeroFill;
	bool_t Unsigned;
	bool_t Sign;
	bool_t AlignLeft;
    bool_t Long;
    int Decimals;
	const tchar_t *In;
	const char *InA;
	size_t n;
    int64_t lvs,_lvs,ww;

	while (OutLen>1 && *Mask)
	{
		switch (*Mask)
		{
		case '%':
			++Mask;

			if (*Mask == '%')
			{
				*(Out++) = *(Mask++);
				--OutLen;
				break;
			}

			AlignLeft = *Mask=='-';
			if (AlignLeft)
				++Mask;

			ZeroFill = *Mask=='0';
			if (ZeroFill)
				++Mask;

			Width = -1;
			if (IsDigit(*Mask))
			{
				Width = 0;
				for (;IsDigit(*Mask);++Mask)
					Width = Width*10 + (*Mask-'0');
			}

            Decimals = *Mask=='.';
			if (Decimals)
            {
				++Mask;
                Decimals = 0;
			    if (IsDigit(*Mask))
			    {
				    for (;IsDigit(*Mask);++Mask)
					    Decimals = Decimals*10 + (*Mask-'0');
			    }
            }

            Long = 0;
            if (*Mask == '*')
			{
				++Mask;
				Width = va_arg(Arg,int);
			}

            while (*Mask == 'l')
            {
                Long=1;
				++Mask; // long
            }

            if (*Mask=='I' && *(Mask+1)=='6' && *(Mask+2)=='4')
            {
                Long=1;
				Mask += 3;
            }

			Unsigned = *Mask=='u';
			if (Unsigned)
				++Mask;

			switch (*Mask)
			{
			case 'd':
			case 'i':
			case 'X':
			case 'x':
                if (Long)
				    vl = va_arg(Arg,int64_t);
                else
				    vl = va_arg(Arg,int);

				if (*Mask=='x' || *Mask=='X')
				{
					Unsigned = 1;
					q = 16;
					ww = 0x10000000;
				}
				else
				{
					q = 10;
					ww = 100000000000;
				}

				Sign = vl<0 && !Unsigned;
				if (Sign)
				{
					vl=-vl;
					--Width;
				}

				w0 = 1;
				for (;Width>1;--Width)
					w0 *= q;

				v = vl;
				while (vl<ww && ww>w0)
					ww/=q;

				while (ww>0)
				{
					unsigned int i = (unsigned int)(vl/ww); // between 0 and q-1
					vl-=i*ww;
					if (OutLen>1 && Sign && (ww==1 || ZeroFill || i>0))
					{
						*(Out++) = '-';
						--OutLen;
						Sign = 0;
					}
					if (OutLen>1)
					{
						if (i==0 && !ZeroFill && ww!=1)
							i = ' ';
						else
						{
							ZeroFill = 1;
							if (i>=10)
							{
								if (*Mask == 'X')
									i += 'A'-10;
								else
									i += 'a'-10;
							}
							else
								i+='0';
						}
						*(Out++) = (tchar_t)i;
						--OutLen;
					}
					ww/=q;
				}

				break;

			case 'c':
				Width -= 1;
				if (!AlignLeft)
					while (--Width>=0 && OutLen>1)
					{
						*Out++ = ' ';
						--OutLen;
					}
				*(Out++) = (tchar_t)va_arg(Arg,int);
				--OutLen;
				while (--Width>=0 && OutLen>1)
				{
					*Out++ = ' ';
					--OutLen;
				}
				break;

			case 's':
				In = va_arg(Arg,const tchar_t*);
                if (In)
                {
				    n = MIN(tcslen(In),OutLen-1);
				    Width -= n;
				    if (!AlignLeft)
					    while (--Width>=0 && OutLen>1)
					    {
						    *Out++ = ' ';
						    --OutLen;
					    }
				    memcpy(Out,In,n*sizeof(tchar_t));
				    Out += n;
				    OutLen -= n;
				    while (--Width>=0 && OutLen>1)
				    {
					    *Out++ = ' ';
					    --OutLen;
				    }
                }
				break;
			case 'S':
				InA = va_arg(Arg,const char*);
				n = MIN(strlen(InA),OutLen-1);
				Width -= n;
				if (!AlignLeft)
					while (--Width>=0 && OutLen>1)
					{
						*Out++ = ' ';
						--OutLen;
					}
                for (;n>0 && OutLen>1 && *InA;++InA,++Out,--OutLen,--n)
                    *Out = *InA;
    			while (--Width>=0 && OutLen>1)
				{
					*Out++ = ' ';
					--OutLen;
				}
				break;
            case 'g':
            case 'G':
            case 'f':
                dvs = va_arg(Arg,double);
                if (OutLen)
                {
			        Sign = dvs<0;
                    if (Sign && OutLen>1)
                        dvs = -dvs;

                    if (Width >= 0)
                    {
                        // count integer digits and decimal digits to adjust the alignment
                        int max_integer_digits = get_integers((int64_t)dvs);
                        int max_decimal_digits = get_decimals(Width - max_integer_digits - 1 - (Sign?1:0),(int64_t)dvs);
                        int max_total_chars;

                        vs = (int)dvs;
                        lvs = 1;
                        _lvs = vs;
                        w = w0 = 0; // decimals in use
                        while (max_decimal_digits-->0)
                        {
                            lvs *= 10;
                            _lvs *= 10;
                            q = (int)(dvs * lvs - (double)_lvs);
                            _lvs += q;
                            w0++;
                            if (q)
                                w = w0;
                        }

                        if (Decimals>0)
                            max_decimal_digits = MAX(Decimals,(int)w);
                        else
                            max_decimal_digits = w;

                        max_total_chars = max_integer_digits + max_decimal_digits + (Sign?1:0) + (max_decimal_digits?1:0);

                        if (max_integer_digits + (Sign?1:0) + (max_decimal_digits?1:0) > Width)
                            goto do_exponent;

                        while (!AlignLeft && Width > max_total_chars && OutLen > 1)
                        {
                            *Out++ = ' ';
                            --Width;
                            --OutLen;
                        }
                    }

                    // integer part
                    vs = (int)dvs;
			        v = vs;

                    if (Sign && dvs!=0.0 && OutLen > 1)
                    {
                        *Out++ = '-';
                        --OutLen;
                    }

				    w = 1000000000;
			        while (w>v && w>1)
				        w/=10;

                    // integer filling
                    while (w>0)
			        {
				        unsigned int i = v/w;
				        v-=i*w;
				        if (OutLen>1 && (Width<0 || Width-->0))
				        {
					        i+='0';
					        *(Out++) = (tchar_t)i;
					        --OutLen;
                        }
				        w/=10;
                    }

                    // decimal part
                    // dry run to count the number of necessary decimals
                    v = Decimals;
                    if (!Decimals)
                        Decimals=30;
                    Decimals = get_decimals(Decimals,vs);
                    lvs = 1;
                    _lvs = vs;
                    w = w0 = 0; // decimals in use
                    while (Decimals-->0)
                    {
                        lvs *= 10;
                        _lvs *= 10;
                        q = (int)(dvs * lvs - (double)_lvs);
                        _lvs += q;
                        w0++;
                        if (q)
                            w = w0;
                    }

                    if (*Mask==T('f') && w)
                        w = MAX(w,6);
                    if (w && OutLen>1)
                    {
                        *Out++ = T('.');
                        --OutLen;
                        --Width;

                        v -= w;

                        lvs = 1;
                        _lvs = vs;
                        while (w-->0 && OutLen>1)
                        {
                            lvs *= 10;
                            _lvs *= 10;
                            q = (int)(dvs * lvs - (double)_lvs);
                            _lvs += q;
                            if (w==0) // last one, do some rounding
                            {
                                if ((dvs * lvs - (double)_lvs) >= 5)
                                    q++;
                            }
                            *Out++ = (tchar_t)(q + '0');
                            --OutLen;
                            --Width;
                        }
                        while (Width-- > 0 && OutLen > 1)
                        {
                            *Out++ = ' ';
                            --OutLen;
                        }
                    }
                    break;
do_exponent:
                    // TODO
                    *Out++ = T('e');
                    OutLen--;
                }
                break;
            case 'e':
            case 'E':
                dvs = va_arg(Arg,double);
				Sign = dvs<0;
                if (Sign && OutLen>1)
                {
                    *Out++ = '-';
                    OutLen--;
                    dvs = -dvs;
                }
                vs = 0; // exponent
                _dvs = 1.0; // factor
                if (dvs >= 1.0)
                {
                    while (dvs*_dvs > 1.0)
                    {
                        _dvs *= 10.0;
                        vs++;
                    }
                    dvs *= 10.0;
                    vs--;
                }
                else
                {
                    while (dvs*_dvs < 1.0)
                    {
                        _dvs *= 10.0;
                        vs--;
                    }
                }

                dvs *= _dvs;
                if (OutLen > 4)
                {
                    *Out++ = (tchar_t)((int)dvs + T('0'));
                    *Out++ = T('.');
                    dvs -= (int)dvs;
                    dvs *= 10.0;
                    if (dvs - (int)dvs > 0.5)
                        *Out++ = (tchar_t)((int)(dvs+1) + T('0'));
                    else
                        *Out++ = (tchar_t)((int)(dvs) + T('0'));
                    *Out++ = *Mask;
                    OutLen -= 4;
                }
                if (OutLen > 1 && vs < 0)
                {
                    *Out++ = T('-');
                    OutLen--;
                    vs = -vs;
                }
                if (OutLen > 3)
                {
                    *Out++ = (tchar_t)((vs / 100) + T('0'));
                    vs %= 100;
                    *Out++ = (tchar_t)((vs / 10) + T('0'));
                    vs %= 10;
                    *Out++ = (tchar_t)(vs + T('0'));
                    OutLen -= 3;
                }
                break;
            case 'p':
                while (Width > 8 && !AlignLeft && OutLen > 1)
                {
                    Width--;
                    *Out++ = ' ';
                    OutLen--;
                }
                ptr = va_arg(Arg,intptr_t);
                for (vs=28;OutLen>1 && vs>=0;vs-=4)
                {
                    q = (ptr>>vs) & 0x0F;
                    if (q<10)
                        *Out++ = (tchar_t)(q+T('0'));
                    else
                        *Out++ = (tchar_t)(q+T('A')-10);
                    OutLen--;
                }
                while (Width > 8 && OutLen > 1)
                {
                    Width--;
                    *Out++ = ' ';
                    OutLen--;
                }
                break;
            case 'r':
                {
                    fourcc_t FourCC = va_arg(Arg,fourcc_t);
                    if (OutLen > 4)
                    {
                        size_t Written = FourCCToString(Out,OutLen,FourCC);
                        Out+=Written;
                        OutLen+=Written;
                    }
                }
                break;
			}

			++Mask;
			break;

		default:
			*(Out++) = *(Mask++);
			--OutLen;
			break;
		}
	}

	assert(OutLen>0);
    if (OutLen>0)
        *Out=0;
}